

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

int nn_poll(nn_pollfd *fds,int nfds,int timeout)

{
  nn_fsm **self;
  nn_fsm **self_00;
  nn_efd *self_01;
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  int extraout_EAX_03;
  int extraout_EAX_04;
  int extraout_EAX_05;
  int extraout_EAX_06;
  pollfd *__fds;
  int *piVar4;
  nn_pool *pool;
  _func_void_nn_sockbase_ptr_nn_pipe_ptr *UNRECOVERED_JUMPTABLE;
  undefined8 *puVar5;
  nn_ep *in_RCX;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  int extraout_EDX_03;
  ulong extraout_RDX;
  long lVar6;
  uint uVar7;
  undefined4 in_register_00000034;
  nn_fsm *self_02;
  nn_sock *self_03;
  nn_sockbase *pnVar8;
  nn_list *self_04;
  int iVar9;
  ulong uVar10;
  bool bVar11;
  int fd;
  size_t sz;
  int local_44;
  size_t local_40;
  int local_38;
  int local_34;
  
  lVar6 = CONCAT44(in_register_00000034,nfds);
  self_02 = (nn_fsm *)((long)nfds << 4);
  __fds = (pollfd *)nn_alloc_((size_t)self_02);
  if (__fds != (pollfd *)0x0) {
    if (nfds == 0) {
      iVar2 = 0;
      iVar9 = poll(__fds,0,timeout);
      if (iVar9 < 1) goto LAB_0011fd0f;
    }
    else {
      uVar10 = 0;
      iVar9 = 0;
      local_38 = nfds;
      local_34 = timeout;
      do {
        uVar1 = fds[uVar10].events;
        if ((uVar1 & 1) != 0) {
          local_40 = 4;
          self_02 = (nn_fsm *)(ulong)(uint)fds[uVar10].fd;
          lVar6 = 0;
          in_RCX = (nn_ep *)&stack0xffffffffffffffbc;
          iVar2 = nn_getsockopt(fds[uVar10].fd,0,0xb,in_RCX,&stack0xffffffffffffffc0);
          if (iVar2 < 0) goto LAB_0011fd46;
          if (local_40 == 4) {
            __fds[iVar9].fd = local_44;
            __fds[iVar9].events = 1;
            iVar9 = iVar9 + 1;
            uVar1 = fds[uVar10].events;
            goto LAB_0011fc12;
          }
          nn_poll_cold_1();
LAB_0011fd66:
          nn_poll_cold_2();
          goto LAB_0011fd6b;
        }
LAB_0011fc12:
        if ((uVar1 & 2) != 0) {
          local_40 = 4;
          self_02 = (nn_fsm *)(ulong)(uint)fds[uVar10].fd;
          lVar6 = 0;
          in_RCX = (nn_ep *)&stack0xffffffffffffffbc;
          iVar2 = nn_getsockopt(fds[uVar10].fd,0,10,in_RCX,&stack0xffffffffffffffc0);
          if (iVar2 < 0) {
LAB_0011fd46:
            nn_free(__fds);
            piVar4 = __errno_location();
            *piVar4 = -iVar2;
            return -1;
          }
          if (local_40 != 4) goto LAB_0011fd66;
          __fds[iVar9].fd = local_44;
          __fds[iVar9].events = 1;
          iVar9 = iVar9 + 1;
        }
        uVar10 = uVar10 + 1;
      } while ((uint)nfds != uVar10);
      iVar9 = poll(__fds,(long)iVar9,local_34);
      if (iVar9 < 1) {
LAB_0011fd0f:
        piVar4 = __errno_location();
        iVar2 = *piVar4;
        nn_free(__fds);
        *piVar4 = iVar2;
        return iVar9;
      }
      if (local_38 == 0) {
        iVar2 = 0;
      }
      else {
        uVar10 = 0;
        iVar2 = 0;
        iVar9 = 0;
        do {
          fds[uVar10].revents = 0;
          if ((fds[uVar10].events & 1U) == 0) {
            uVar1 = 0;
          }
          else {
            bVar11 = (__fds[iVar9].revents & 1) != 0;
            if (bVar11) {
              fds[uVar10].revents = 1;
            }
            uVar1 = (ushort)bVar11;
            iVar9 = iVar9 + 1;
          }
          if ((fds[uVar10].events & 2U) != 0) {
            if ((__fds[iVar9].revents & 1) != 0) {
              uVar1 = uVar1 | 2;
              fds[uVar10].revents = uVar1;
            }
            iVar9 = iVar9 + 1;
          }
          iVar2 = (iVar2 + 1) - (uint)(uVar1 == 0);
          uVar10 = uVar10 + 1;
        } while ((uint)nfds != uVar10);
      }
    }
    nn_free(__fds);
    return iVar2;
  }
LAB_0011fd6b:
  nn_poll_cold_3();
  if ((~*(uint *)(lVar6 + 8) & 3) == 0) {
    nn_sock_init_cold_2();
    uVar7 = (uint)lVar6;
    uVar3 = extraout_EAX;
  }
  else {
    self = &self_02[1].owner;
    pool = nn_global_getpool();
    nn_ctx_init((nn_ctx *)self,pool,nn_sock_onleave);
    in_RCX = (nn_ep *)self;
    nn_fsm_init_root(self_02,nn_sock_handler,nn_sock_shutdown,(nn_ctx *)self);
    *(undefined4 *)&self_02[1].fn = 1;
    self_00 = &self_02[2].owner;
    if ((*(byte *)(lVar6 + 8) & 2) == 0) {
      iVar9 = nn_efd_init((nn_efd *)self_00);
      if (iVar9 < 0) {
        return iVar9;
      }
    }
    else {
      *(undefined4 *)self_00 = 0xcdcdcdcd;
    }
    self_01 = (nn_efd *)((long)&self_02[2].owner + 4);
    if ((*(byte *)(lVar6 + 8) & 1) == 0) {
      iVar9 = nn_efd_init(self_01);
      if (iVar9 < 0) {
        if ((*(byte *)(lVar6 + 8) & 2) != 0) {
          return iVar9;
        }
        nn_efd_term((nn_efd *)self_00);
        return iVar9;
      }
    }
    else {
      self_01->efd = -0x32323233;
    }
    nn_sem_init((nn_sem *)&self_02[2].ctx);
    nn_sem_init((nn_sem *)&self_02[2].stopped.type);
    *(undefined4 *)((long)&self_02[3].stopped.fsm + 4) = 1;
    *(undefined4 *)&self_02[1].srcptr = 0;
    nn_list_init((nn_list *)&self_02[3].state);
    nn_list_init((nn_list *)&self_02[3].owner);
    *(undefined4 *)&self_02[3].stopped.fsm = 1;
    *(undefined8 *)&self_02[3].stopped.src = 0x20000000003e8;
    self_02[3].stopped.srcptr = (void *)0x10000000020000;
    *(undefined8 *)&self_02[3].stopped.type = 0xffffffffffffffff;
    self_02[3].stopped.item.next = (nn_queue_item *)0x64;
    self_02[4].fn = (nn_fsm_fn)0x800000008;
    *(undefined4 *)&self_02[4].shutdown_fn = 1;
    self_02[4].stopped.fsm = (nn_fsm *)0x0;
    *(undefined8 *)&self_02[4].stopped.src = 0;
    self_02[4].stopped.srcptr = (void *)0x0;
    *(undefined8 *)&self_02[4].stopped.type = 0;
    self_02[4].stopped.item.next = (nn_queue_item *)0x0;
    self_02[5].fn = (nn_fsm_fn)0x0;
    self_02[5].shutdown_fn = (nn_fsm_fn)0x0;
    self_02[5].state = 0;
    self_02[5].src = 0;
    self_02[5].srcptr = (void *)0x0;
    self_02[5].owner = (nn_fsm *)0x0;
    self_02[5].ctx = (nn_ctx *)0x0;
    self_02[5].stopped.fsm = (nn_fsm *)0x0;
    *(undefined8 *)&self_02[5].stopped.src = 0;
    sprintf((char *)&self_02[5].stopped.srcptr,"%d",(ulong)extraout_EDX);
    self_02[6].ctx = (nn_ctx *)0x0;
    self_02[6].stopped.fsm = (nn_fsm *)0x0;
    *(undefined8 *)&self_02[6].stopped.src = 0x100000001000;
    self_02[4].state = 0;
    self_02[4].src = 0;
    self_02[4].srcptr = (void *)0x0;
    self_02[4].owner = (nn_fsm *)0x0;
    self_02[4].ctx = (nn_ctx *)0x0;
    uVar7 = (int)self_02 + 0x60;
    uVar3 = (**(code **)(lVar6 + 0x10))(self_02);
    if (uVar3 == 0) {
      self_02[1].state = (int)lVar6;
      self_02[1].src = (int)((ulong)lVar6 >> 0x20);
      nn_ctx_enter((nn_ctx *)self);
      nn_fsm_start(self_02);
      nn_ctx_leave((nn_ctx *)self);
      return 0;
    }
  }
  uVar10 = (ulong)uVar3;
  nn_sock_init_cold_1();
  lVar6 = uVar10 - 0x78;
  if (uVar10 == 0) {
    lVar6 = 0;
  }
  if (*(int *)(lVar6 + 0x58) != 2) {
    return extraout_EAX_00;
  }
  uVar3 = (**(code **)(**(long **)(lVar6 + 0x60) + 0x30))();
  if (-1 < (int)uVar3) {
    nn_sock_onleave_cold_1();
    return extraout_EAX_01;
  }
  self_03 = (nn_sock *)(ulong)uVar3;
  nn_sock_onleave_cold_2();
  uVar3 = (uint)extraout_RDX;
  iVar9 = self_03->state;
  if (iVar9 == 1) {
LAB_0011ffd0:
    if (uVar7 == 0xfffffffe) {
      if (uVar3 == 1) {
LAB_0011fff0:
        nn_sock_action_zombify(self_03);
        return extraout_EAX_03;
      }
      uVar7 = 0xfffffffe;
      if (uVar3 == 0xfffffffe) {
        self_03->state = 2;
        return iVar9;
      }
    }
    else {
LAB_00120062:
      uVar7 = uVar3;
      nn_sock_handler_cold_5();
    }
    nn_sock_handler_cold_6();
LAB_00120072:
    nn_sock_handler_cold_2();
    uVar3 = extraout_EDX_02;
  }
  else {
    if (iVar9 != 2) {
      if (iVar9 == 3) {
        nn_sock_handler_cold_1();
      }
      nn_sock_handler_cold_7();
      uVar3 = extraout_EDX_01;
      goto LAB_00120062;
    }
    if (uVar7 == 1) {
      if (uVar3 == 1) {
        nn_list_erase(&self_03->sdeps,&in_RCX->item);
        nn_ep_term(in_RCX);
        nn_free(in_RCX);
        return extraout_EAX_04;
      }
      goto LAB_00120072;
    }
    if (uVar7 == 0xfffffffe) {
      if (uVar3 == 1) goto LAB_0011fff0;
      self_03 = (nn_sock *)(extraout_RDX & 0xffffffff);
      nn_sock_handler_cold_3();
      iVar9 = extraout_EAX_02;
      uVar3 = extraout_EDX_00;
      goto LAB_0011ffd0;
    }
    if (uVar3 == 0x84c4) {
      pnVar8 = self_03->sockbase;
      UNRECOVERED_JUMPTABLE = pnVar8->vfptr->out;
LAB_00120047:
      iVar9 = (*UNRECOVERED_JUMPTABLE)(pnVar8,(nn_pipe *)in_RCX);
      return iVar9;
    }
    if (uVar3 == 0x84c3) {
      pnVar8 = self_03->sockbase;
      UNRECOVERED_JUMPTABLE = pnVar8->vfptr->in;
      goto LAB_00120047;
    }
  }
  uVar10 = (ulong)uVar7;
  nn_sock_handler_cold_4();
  uVar7 = *(uint *)(uVar10 + 0x58);
  self_04 = (nn_list *)(ulong)uVar7;
  if (extraout_EDX_03 == -3 && (uVar3 ^ 0xfffffffe) == 0) {
LAB_001200b0:
    nn_sock_shutdown_cold_3();
  }
  else {
    if (uVar7 != 4) {
      if (uVar7 == 5) {
        if ((uVar3 != 0xfffffffe) || (extraout_EDX_03 != 2)) {
          nn_sock_shutdown_cold_1();
          goto LAB_0012019a;
        }
        puVar5 = (undefined8 *)**(undefined8 **)(uVar10 + 0x60);
        goto LAB_00120147;
      }
      nn_sock_shutdown_cold_2();
      goto LAB_001200b0;
    }
    if (extraout_EDX_03 != 1 || uVar3 != 1) {
      return uVar3 ^ 0xfffffffe;
    }
    nn_list_erase((nn_list *)(uVar10 + 0x128),&in_RCX->item);
    nn_ep_term(in_RCX);
    nn_free(in_RCX);
  }
  iVar9 = nn_list_empty((nn_list *)(uVar10 + 0x128));
  if (iVar9 == 0) {
    return 0;
  }
  self_04 = (nn_list *)(uVar10 + 0x118);
  iVar9 = nn_list_empty(self_04);
  if (iVar9 == 0) {
LAB_0012019a:
    nn_sock_shutdown_cold_4();
    self_04[3].first = (nn_list_item *)self_04;
    *(undefined4 *)&self_04[3].last = 0xfffffffe;
    self_04[4].first = (nn_list_item *)0x0;
    *(undefined4 *)&self_04[4].last = 2;
    nn_ctx_raise((nn_ctx *)self_04[2].last,(nn_fsm_event *)(self_04 + 3));
    return extraout_EAX_06;
  }
  *(undefined4 *)(uVar10 + 0x58) = 5;
  puVar5 = (undefined8 *)**(undefined8 **)(uVar10 + 0x60);
  if ((code *)*puVar5 != (code *)0x0) {
    iVar9 = (*(code *)*puVar5)();
    return iVar9;
  }
LAB_00120147:
  (*(code *)puVar5[1])();
  *(undefined4 *)(uVar10 + 0x58) = 6;
  uVar7 = *(uint *)(*(long *)(uVar10 + 0x68) + 8);
  if ((uVar7 & 1) == 0) {
    nn_efd_term((nn_efd *)(uVar10 + 0xd4));
    uVar7 = *(uint *)(*(long *)(uVar10 + 0x68) + 8);
  }
  if ((uVar7 & 2) == 0) {
    nn_efd_term((nn_efd *)(uVar10 + 0xd0));
  }
  nn_sem_post((nn_sem *)(uVar10 + 0xd8));
  return extraout_EAX_05;
}

Assistant:

int nn_poll (struct nn_pollfd *fds, int nfds, int timeout)
{
    int rc;
    int i;
    int pos;
    int fd;
    int res;
    size_t sz;
    struct pollfd *pfd;

    /*  Construct a pollset to be used with OS-level 'poll' function. */
    pfd = nn_alloc (sizeof (struct pollfd) * nfds * 2, "pollset");
    alloc_assert (pfd);
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        if (fds [i].events & NN_POLLIN) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_RCVFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                errno = -rc;
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            sz = sizeof (fd);
            rc = nn_getsockopt (fds [i].fd, NN_SOL_SOCKET, NN_SNDFD, &fd, &sz);
            if (nn_slow (rc < 0)) {
                nn_free (pfd);
                errno = -rc;
                return -1;
            }
            nn_assert (sz == sizeof (fd));
            pfd [pos].fd = fd;
            pfd [pos].events = POLLIN;
            ++pos;
        }
    }    

    /*  Do the polling itself. */
    rc = poll (pfd, pos, timeout);
    if (nn_slow (rc <= 0)) {
        res = errno;
        nn_free (pfd);
        errno = res;
        return rc;
    }

    /*  Move the results from OS-level poll to nn_poll's pollset. */
    res = 0;
    pos = 0;
    for (i = 0; i != nfds; ++i) {
        fds [i].revents = 0;
        if (fds [i].events & NN_POLLIN) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLIN;
            ++pos;
        }
        if (fds [i].events & NN_POLLOUT) {
            if (pfd [pos].revents & POLLIN)
                fds [i].revents |= NN_POLLOUT;
            ++pos;
        }
        if (fds [i].revents)
            ++res;
    }

    nn_free (pfd);
    return res;
}